

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

void elt_mul(u8 *d,u8 *a,u8 *b)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  
  d[0xe] = '\0';
  d[0xf] = '\0';
  d[0x10] = '\0';
  d[0x11] = '\0';
  d[0x12] = '\0';
  d[0x13] = '\0';
  d[0x14] = '\0';
  d[0x15] = '\0';
  d[0x16] = '\0';
  d[0x17] = '\0';
  d[0x18] = '\0';
  d[0x19] = '\0';
  d[0x1a] = '\0';
  d[0x1b] = '\0';
  d[0x1c] = '\0';
  d[0x1d] = '\0';
  d[0] = '\0';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  d[4] = '\0';
  d[5] = '\0';
  d[6] = '\0';
  d[7] = '\0';
  d[8] = '\0';
  d[9] = '\0';
  d[10] = '\0';
  d[0xb] = '\0';
  d[0xc] = '\0';
  d[0xd] = '\0';
  d[0xe] = '\0';
  d[0xf] = '\0';
  uVar4 = 1;
  uVar6 = 0;
  for (iVar7 = 0; iVar7 != 0xe9; iVar7 = iVar7 + 1) {
    bVar1 = *d;
    bVar2 = 0;
    for (lVar3 = 1; lVar3 != 0x1e; lVar3 = lVar3 + 1) {
      d[lVar3 + -1] = d[lVar3] >> 7 | bVar2;
      bVar2 = d[lVar3] * '\x02';
    }
    d[0x1d] = bVar2 | bVar1 & 1;
    d[0x14] = d[0x14] ^ (bVar1 & 1) << 2;
    if ((uVar4 & a[uVar6]) != 0) {
      elt_add(d,d,b);
    }
    uVar5 = uVar4 >> 1;
    uVar4 = uVar5;
    if (uVar5 == 0) {
      uVar4 = 0x80;
    }
    uVar6 = (ulong)((int)uVar6 + (uint)(uVar5 == 0));
  }
  return;
}

Assistant:

static void elt_mul(u8 *d, u8 *a, u8 *b)
{
	u32 i, n;
	u8 mask;

	elt_zero(d);

	i = 0;
	mask = 1;
	for (n = 0; n < 233; n++) {
		elt_mul_x(d, d);

		if ((a[i] & mask) != 0)
			elt_add(d, d, b);

		mask >>= 1;
		if (mask == 0) {
			mask = 0x80;
			i++;
		}
	}
}